

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O2

void __thiscall duel::checkEnd(duel *this)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  
  uVar1 = (this->field1).pile;
  uVar2 = (this->field2).pile;
  if (uVar2 < uVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Player 1 wins!");
    std::endl<char,std::char_traits<char>>(poVar3);
    player1Score = player1Score + 1;
  }
  else {
    if (uVar2 <= uVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Tie!");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Player 2 wins!");
    std::endl<char,std::char_traits<char>>(poVar3);
    player2Score = player2Score + 1;
  }
  return;
}

Assistant:

void duel::checkEnd() {
    if(field1.getPile() > field2.getPile()) {
        cout << "Player 1 wins!" << endl;
        player1Score++;
    }
    else if(field2.getPile() > field1.getPile()) {
        cout << "Player 2 wins!" << endl;
        player2Score++;
    }
    else cout << "Tie!" << endl;
}